

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O1

void cp_decl_attributes(CPState *cp,CPDecl *decl)

{
  byte *pbVar1;
  char cVar2;
  uint uVar3;
  TValue *pTVar4;
  uint uVar5;
  int iVar6;
  CTSize CVar7;
  GCstr *pGVar8;
  GCstr *pGVar9;
  byte bVar10;
  int iVar11;
  CPToken tok;
  
LAB_001542d0:
  do {
    switch(cp->tok) {
    case 0x118:
      pbVar1 = (byte *)((long)&decl->attr + 3);
      *pbVar1 = *pbVar1 | 2;
      break;
    case 0x119:
      pbVar1 = (byte *)((long)&decl->attr + 3);
      *pbVar1 = *pbVar1 | 1;
      break;
    case 0x11a:
    case 0x121:
    case 0x125:
      break;
    default:
      return;
    case 0x122:
      cp_next(cp);
      cp_check(cp,0x28);
      if (cp->tok == 0x101) {
        pGVar8 = cp->str;
        iVar6 = cp_next(cp);
        while (iVar6 == 0x101) {
          lj_strfmt_pushf(cp->L,"%s%s",pGVar8 + 1,cp->str + 1);
          pTVar4 = cp->L->top;
          cp->L->top = pTVar4 + -1;
          pGVar8 = (GCstr *)(ulong)pTVar4[-1].u32.lo;
          iVar6 = cp_next(cp);
        }
        decl->redir = pGVar8;
      }
      goto LAB_001545f2;
    case 0x123:
      cp_next(cp);
      cp_check(cp,0x28);
      cp_check(cp,0x28);
      do {
        iVar6 = cp->tok;
        if (iVar6 == 0x100) {
          pGVar8 = cp->str;
          uVar3 = pGVar8->len;
          if (((((0xc < uVar3) && ((char)pGVar8[1].nextgc.gcptr32 == '_')) &&
               (*(char *)((long)&pGVar8[1].nextgc.gcptr32 + 1) == '_')) &&
              ((*(char *)((long)&pGVar8[1].nextgc.gcptr32 + 2) != '_' &&
               (*(char *)((long)&pGVar8[1].nextgc.gcptr32 + (ulong)(uVar3 - 2)) == '_')))) &&
             (*(char *)((long)&pGVar8[1].nextgc.gcptr32 + (ulong)(uVar3 - 1)) == '_')) {
            pGVar8 = lj_str_new(cp->L,(char *)((long)&pGVar8[1].nextgc.gcptr32 + 2),
                                (ulong)(uVar3 - 4));
          }
          cp_next(cp);
          iVar6 = lj_cparse_case(pGVar8,
                                 "\aaligned\v__aligned__\x06packed\n__packed__\x04mode\b__mode__\vvector_size\x0f__vector_size__"
                                );
          switch(iVar6) {
          case 0:
          case 1:
            cp_decl_align(cp,decl);
            break;
          case 2:
          case 3:
            *(byte *)&decl->attr = (byte)decl->attr | 2;
            break;
          case 4:
          case 5:
            cp_check(cp,0x28);
            if (cp->tok != 0x100) goto LAB_0015453d;
            pGVar8 = cp->str;
            pGVar9 = pGVar8 + 1;
            if (((char)pGVar8[1].nextgc.gcptr32 == '_') &&
               (*(char *)((long)&pGVar8[1].nextgc.gcptr32 + 1) == '_')) {
              pGVar9 = (GCstr *)((long)&pGVar8[1].nextgc.gcptr32 + 2);
            }
            iVar6 = 0;
            if ((char)(pGVar9->nextgc).gcptr32 == 'V') {
              iVar6 = *(char *)((long)&(pGVar9->nextgc).gcptr32 + 1) + -0x30;
              bVar10 = *(char *)((long)&(pGVar9->nextgc).gcptr32 + 2) - 0x30;
              if (bVar10 < 10) {
                pGVar9 = (GCstr *)((long)&(pGVar9->nextgc).gcptr32 + 3);
                iVar6 = (uint)bVar10 + iVar6 * 10;
              }
              else {
                pGVar9 = (GCstr *)((long)&(pGVar9->nextgc).gcptr32 + 2);
              }
            }
            cVar2 = (char)(pGVar9->nextgc).gcptr32;
            switch(cVar2) {
            case 'O':
              iVar11 = 0x20;
              break;
            case 'P':
            case 'R':
              goto switchD_001544bd_caseD_50;
            case 'Q':
              iVar11 = 1;
              break;
            case 'S':
              iVar11 = 4;
              break;
            case 'T':
              iVar11 = 0x10;
              break;
            default:
              if (cVar2 == 'D') {
                iVar11 = 8;
              }
              else {
                if (cVar2 != 'H') goto switchD_001544bd_caseD_50;
                iVar11 = 2;
              }
            }
            cVar2 = *(char *)((long)&(pGVar9->nextgc).gcptr32 + 1);
            if ((cVar2 == 'I') || (cVar2 == 'F')) {
              uVar3 = decl->attr;
              decl->attr = iVar11 << 8 | uVar3 & 0xffff00ff;
              if (iVar6 != 0) {
                uVar5 = 0x1f;
                if (iVar11 * iVar6 != 0) {
                  for (; (uint)(iVar11 * iVar6) >> uVar5 == 0; uVar5 = uVar5 - 1) {
                  }
                }
                decl->attr = ((~uVar5 & 0xf) << 4 | iVar11 << 8 | uVar3 & 0xffff000f) ^ 0xf0;
              }
            }
switchD_001544bd_caseD_50:
            cp_next(cp);
            goto LAB_0015453d;
          case 6:
          case 7:
            CVar7 = cp_decl_sizeattr(cp);
            if (CVar7 != 0) {
              uVar3 = 0x1f;
              if (CVar7 != 0) {
                for (; CVar7 >> uVar3 == 0; uVar3 = uVar3 - 1) {
                }
              }
              decl->attr = ((~uVar3 & 0xf) << 4 | decl->attr & 0xffffff0f) ^ 0xf0;
            }
            break;
          default:
            goto switchD_001543f4_default;
          }
        }
        else {
          if ((iVar6 == 0x29) || (iVar6 < 0x10d)) goto LAB_0015455e;
          cp_next(cp);
switchD_001543f4_default:
          if (cp->tok != 0x28) goto LAB_0015454a;
          do {
            cp_next(cp);
            if (cp->tok == 0x103) break;
          } while (cp->tok != 0x29);
LAB_0015453d:
          cp_check(cp,0x29);
        }
LAB_0015454a:
        if (cp->tok != 0x2c) goto LAB_0015455e;
        cp_next(cp);
      } while( true );
    case 0x124:
      cp_next(cp);
      tok = 0x28;
      do {
        cp_check(cp,tok);
        do {
          while( true ) {
            if (cp->tok != 0x100) goto LAB_001545f2;
            pGVar8 = cp->str;
            cp_next(cp);
            if ((pGVar8->len != 5) ||
               (pGVar8[1].marked != 'n' || pGVar8[1].nextgc.gcptr32 != 0x67696c61)) break;
            cp_decl_align(cp,decl);
          }
        } while (cp->tok != 0x28);
        do {
          cp_next(cp);
          if (cp->tok == 0x103) break;
        } while (cp->tok != 0x29);
        tok = 0x29;
      } while( true );
    case 0x126:
      *(char *)((long)&decl->attr + 1) = (char)cp->ct->size;
    }
    cp_next(cp);
  } while( true );
LAB_0015455e:
  cp_check(cp,0x29);
LAB_001545f2:
  cp_check(cp,0x29);
  goto LAB_001542d0;
}

Assistant:

static void cp_decl_attributes(CPState *cp, CPDecl *decl)
{
  for (;;) {
    switch (cp->tok) {
    case CTOK_CONST: decl->attr |= CTF_CONST; break;
    case CTOK_VOLATILE: decl->attr |= CTF_VOLATILE; break;
    case CTOK_RESTRICT: break;  /* Ignore. */
    case CTOK_EXTENSION: break;  /* Ignore. */
    case CTOK_ATTRIBUTE: cp_decl_gccattribute(cp, decl); continue;
    case CTOK_ASM: cp_decl_asm(cp, decl); continue;
    case CTOK_DECLSPEC: cp_decl_msvcattribute(cp, decl); continue;
    case CTOK_CCDECL:
#if LJ_TARGET_X86
      CTF_INSERT(decl->fattr, CCONV, cp->ct->size);
      decl->fattr |= CTFP_CCONV;
#endif
      break;
    case CTOK_PTRSZ:
#if LJ_64
      CTF_INSERT(decl->attr, MSIZEP, cp->ct->size);
#endif
      break;
    default: return;
    }
    cp_next(cp);
  }
}